

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

void lzma_check_finish(lzma_check_state *check,lzma_check type)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  uint8_t uVar5;
  bool bVar6;
  
  if (type == LZMA_CHECK_SHA256) {
    uVar5 = 0x80;
    uVar3 = (ulong)((uint)(check->state).sha256.size & 0x3f);
    do {
      while ((check->buffer).u8[uVar3] = uVar5, uVar3 == 0x3f) {
        process(check);
        uVar5 = '\0';
        uVar3 = 0;
      }
      uVar5 = '\0';
      bVar6 = uVar3 != 0x37;
      uVar3 = uVar3 + 1;
    } while (bVar6);
    uVar2 = (check->state).sha256.size;
    uVar3 = uVar2 << 3;
    (check->state).sha256.size = uVar3;
    (check->buffer).u64[7] =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar2 << 0x3b;
    process(check);
    lVar4 = 0;
    do {
      uVar1 = *(uint *)((long)&check->state + lVar4 * 4);
      (check->buffer).u32[lVar4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    return;
  }
  if (type == LZMA_CHECK_CRC64) {
    (check->buffer).u64[0] = (check->state).crc64;
  }
  else if (type == LZMA_CHECK_CRC32) {
    (check->buffer).u32[0] = (check->state).crc32;
    return;
  }
  return;
}

Assistant:

extern void
lzma_check_finish(lzma_check_state *check, lzma_check type)
{
	switch (type) {
#ifdef HAVE_CHECK_CRC32
	case LZMA_CHECK_CRC32:
		check->buffer.u32[0] = conv32le(check->state.crc32);
		break;
#endif

#ifdef HAVE_CHECK_CRC64
	case LZMA_CHECK_CRC64:
		check->buffer.u64[0] = conv64le(check->state.crc64);
		break;
#endif

#ifdef HAVE_CHECK_SHA256
	case LZMA_CHECK_SHA256:
		lzma_sha256_finish(check);
		break;
#endif

	default:
		break;
	}

	return;
}